

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O0

Sat_MmStep_t * Sat_MmStepStart(int nSteps)

{
  Sat_MmStep_t *pSVar1;
  Sat_MmFixed_t **ppSVar2;
  Sat_MmFixed_t *pSVar3;
  char **ppcVar4;
  int local_20;
  int local_1c;
  int k;
  int i;
  Sat_MmStep_t *p;
  int nSteps_local;
  
  pSVar1 = (Sat_MmStep_t *)malloc(0x30);
  pSVar1->nMems = nSteps;
  ppSVar2 = (Sat_MmFixed_t **)malloc((long)pSVar1->nMems << 3);
  pSVar1->pMems = ppSVar2;
  for (local_1c = 0; local_1c < pSVar1->nMems; local_1c = local_1c + 1) {
    pSVar3 = Sat_MmFixedStart(8 << ((byte)local_1c & 0x1f));
    pSVar1->pMems[local_1c] = pSVar3;
  }
  pSVar1->nMapSize = 4 << ((byte)pSVar1->nMems & 0x1f);
  ppSVar2 = (Sat_MmFixed_t **)malloc((long)(pSVar1->nMapSize + 1) << 3);
  pSVar1->pMap = ppSVar2;
  *pSVar1->pMap = (Sat_MmFixed_t *)0x0;
  for (local_20 = 1; local_20 < 5; local_20 = local_20 + 1) {
    pSVar1->pMap[local_20] = *pSVar1->pMems;
  }
  for (local_1c = 0; local_1c < pSVar1->nMems; local_1c = local_1c + 1) {
    local_20 = 4 << ((byte)local_1c & 0x1f);
    while (local_20 = local_20 + 1, local_20 <= 8 << ((byte)local_1c & 0x1f)) {
      pSVar1->pMap[local_20] = pSVar1->pMems[local_1c];
    }
  }
  pSVar1->nChunksAlloc = 0x40;
  pSVar1->nChunks = 0;
  ppcVar4 = (char **)malloc((long)pSVar1->nChunksAlloc << 3);
  pSVar1->pChunks = ppcVar4;
  return pSVar1;
}

Assistant:

Sat_MmStep_t * Sat_MmStepStart( int nSteps )
{
    Sat_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Sat_MmStep_t, 1 );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Sat_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Sat_MmFixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Sat_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );
    return p;
}